

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cpp
# Opt level: O1

bool __thiscall Clasp::Solver::unitPropagate(Solver *this)

{
  ulong uVar1;
  size_type sVar2;
  uint uVar3;
  Literal p;
  SharedContext *pSVar4;
  buf_type *pbVar5;
  bool bVar6;
  PropResult PVar7;
  uint uVar8;
  long lVar9;
  pointer pLVar10;
  ulong uVar11;
  buf_type *pbVar12;
  pointer plVar13;
  reverse_iterator<Clasp::GenericWatch_*> __tmp;
  buf_type *pbVar14;
  ulong uVar15;
  buf_type *pbVar16;
  uint uVar17;
  
  sVar2 = (this->levels_).super_type.ebo_.size;
  uVar8 = (this->assign_).front;
  if (uVar8 != (this->assign_).trail.ebo_.size) {
    pSVar4 = this->shared_;
    uVar3 = (pSVar4->btig_).graph_.ebo_.size;
    do {
      (this->assign_).front = uVar8 + 1;
      pLVar10 = (this->assign_).trail.ebo_.buf;
      p.rep_ = pLVar10[uVar8].rep_;
      plVar13 = (this->watches_).ebo_.buf + (p.rep_ >> 1);
      if ((p.rep_ >> 1 < uVar3) &&
         (bVar6 = ShortImplicationsGraph::propagate(&pSVar4->btig_,this,p), !bVar6)) {
        return false;
      }
      uVar8 = (plVar13->super_type).super_left_right_rep<Clasp::ClauseWatch,_Clasp::GenericWatch>.
              left_;
      uVar15 = (ulong)uVar8;
      if (7 < uVar15) {
        pbVar14 = (plVar13->super_type).
                  super_left_right_rep<Clasp::ClauseWatch,_Clasp::GenericWatch>.buf_;
        uVar1 = 0;
        pbVar12 = pbVar14;
        do {
          uVar11 = uVar1;
          if (uVar15 == uVar11) {
            (plVar13->super_type).super_left_right_rep<Clasp::ClauseWatch,_Clasp::GenericWatch>.
            left_ = (int)pbVar12 -
                    *(int *)&(plVar13->super_type).
                             super_left_right_rep<Clasp::ClauseWatch,_Clasp::GenericWatch>.buf_;
            goto LAB_0016a8b1;
          }
          PVar7 = ClauseHead::propagate(*(ClauseHead **)(pbVar14 + uVar11),this,p,&pLVar10->rep_);
          if (((ushort)PVar7 >> 8 & 1) != 0) {
            pLVar10 = *(pointer *)(pbVar14 + uVar11);
            *(pointer *)pbVar12 = pLVar10;
            pbVar12 = pbVar12 + 8;
          }
          uVar1 = uVar11 + 8;
        } while (((ushort)PVar7 & 1) != 0);
        if (uVar15 - uVar1 != 0) {
          memmove(pbVar12,pbVar14 + uVar1,uVar15 - uVar1);
        }
        (plVar13->super_type).super_left_right_rep<Clasp::ClauseWatch,_Clasp::GenericWatch>.left_ =
             (((int)pbVar12 -
              *(int *)&(plVar13->super_type).
                       super_left_right_rep<Clasp::ClauseWatch,_Clasp::GenericWatch>.buf_) + uVar8)
             - (int)uVar1;
        if (uVar15 != uVar11) {
          return false;
        }
      }
LAB_0016a8b1:
      uVar8 = (plVar13->super_type).super_left_right_rep<Clasp::ClauseWatch,_Clasp::GenericWatch>.
              right_;
      uVar17 = *(uint *)&(plVar13->super_type).
                         super_left_right_rep<Clasp::ClauseWatch,_Clasp::GenericWatch>.field_0x8 &
               0x7fffffff;
      uVar15 = (ulong)uVar17;
      if (0xf < uVar17 - uVar8) {
        pbVar12 = (plVar13->super_type).
                  super_left_right_rep<Clasp::ClauseWatch,_Clasp::GenericWatch>.buf_;
        pbVar14 = pbVar12 + uVar15;
        uVar1 = (ulong)uVar8;
        pbVar5 = pbVar12 + uVar15 + -0x20;
        do {
          pbVar16 = pbVar5;
          uVar11 = uVar1;
          if (uVar15 == uVar11) {
            (plVar13->super_type).super_left_right_rep<Clasp::ClauseWatch,_Clasp::GenericWatch>.
            right_ = (int)pbVar14 -
                     *(int *)&(plVar13->super_type).
                              super_left_right_rep<Clasp::ClauseWatch,_Clasp::GenericWatch>.buf_;
            goto LAB_0016a98f;
          }
          uVar8 = (**(code **)**(undefined8 **)(pbVar12 + uVar15 + -0x10))
                            (*(undefined8 **)(pbVar12 + uVar15 + -0x10),this,p.rep_);
          if ((uVar8 >> 8 & 1) != 0) {
            *(undefined4 *)(pbVar14 + -8) = *(undefined4 *)(pbVar12 + uVar15 + -8);
            *(undefined8 *)(pbVar14 + -0x10) = *(undefined8 *)(pbVar12 + uVar15 + -0x10);
            pbVar14 = pbVar14 + -0x10;
          }
          pbVar12 = pbVar12 + -0x10;
          uVar1 = uVar11 + 0x10;
          pbVar5 = pbVar16 + -0x10;
        } while ((uVar8 & 1) != 0);
        lVar9 = (long)(uVar15 - (uVar11 + 0x10)) >> 4;
        if (0 < lVar9) {
          lVar9 = lVar9 + 1;
          pbVar12 = pbVar14;
          do {
            pbVar14 = pbVar12 + -0x10;
            *(undefined4 *)(pbVar12 + -8) = *(undefined4 *)(pbVar16 + 8);
            *(undefined8 *)(pbVar12 + -0x10) = *(undefined8 *)pbVar16;
            pbVar16 = pbVar16 + -0x10;
            lVar9 = lVar9 + -1;
            pbVar12 = pbVar14;
          } while (1 < lVar9);
        }
        (plVar13->super_type).super_left_right_rep<Clasp::ClauseWatch,_Clasp::GenericWatch>.right_ =
             (int)pbVar14 -
             *(int *)&(plVar13->super_type).
                      super_left_right_rep<Clasp::ClauseWatch,_Clasp::GenericWatch>.buf_;
        if (uVar15 != uVar11) {
          return false;
        }
      }
LAB_0016a98f:
      uVar8 = (this->assign_).front;
    } while (uVar8 != (this->assign_).trail.ebo_.size);
  }
  if (sVar2 == 0) {
    bVar6 = Assignment::markUnits(&this->assign_);
    return bVar6;
  }
  return true;
}

Assistant:

bool Solver::unitPropagate() {
	assert(!hasConflict());
	Literal p, q, r;
	uint32 idx, ignore, DL = decisionLevel();
	const ShortImplicationsGraph& btig = shared_->shortImplications();
	const uint32 maxIdx = btig.size();
	while ( !assign_.qEmpty() ) {
		p             = assign_.qPop();
		idx           = p.id();
		WatchList& wl = watches_[idx];
		// first: short clause BCP
		if (idx < maxIdx && !btig.propagate(*this, p)) {
			return false;
		}
		// second: clause BCP
		if (wl.left_size() != 0) {
			WatchList::left_iterator it, end, j = wl.left_begin();
			Constraint::PropResult res;
			for (it = wl.left_begin(), end = wl.left_end();  it != end;  ) {
				ClauseWatch& w = *it++;
				res = w.head->ClauseHead::propagate(*this, p, ignore);
				if (res.keepWatch) {
					*j++ = w;
				}
				if (!res.ok) {
					wl.shrink_left(std::copy(it, end, j));
					return false;
				}
			}
			wl.shrink_left(j);
		}
		// third: general constraint BCP
		if (wl.right_size() != 0) {
			WatchList::right_iterator it, end, j = wl.right_begin();
			Constraint::PropResult res;
			for (it = wl.right_begin(), end = wl.right_end(); it != end; ) {
				GenericWatch& w = *it++;
				res = w.propagate(*this, p);
				if (res.keepWatch) {
					*j++ = w;
				}
				if (!res.ok) {
					wl.shrink_right(std::copy(it, end, j));
					return false;
				}
			}
			wl.shrink_right(j);
		}
	}
	return DL || assign_.markUnits();
}